

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_137552::readWriteTestWithAbsoluateCoordinates
               (int channelCount,int testTimes,string *tempDir)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  int compressionIndex;
  Compression compression;
  undefined4 in_register_00000034;
  bool bVar4;
  string fn;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing files with ",0x13);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,channelCount);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3," channels, using absolute coordinates ",0x26);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," times.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::ostream::flush();
  lVar1 = *(long *)CONCAT44(in_register_00000034,testTimes);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar1,((long *)CONCAT44(in_register_00000034,testTimes))[1] + lVar1
            );
  std::__cxx11::string::append((char *)&local_50);
  compression = NO_COMPRESSION;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    generateRandomFile(channelCount,compression,false,false,&local_50);
    readFile(channelCount,false,false,false,&local_50);
    readFile(channelCount,false,false,true,&local_50);
    remove(local_50._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::ostream::flush();
    generateRandomFile(channelCount,compression,true,false,&local_50);
    readFile(channelCount,true,false,false,&local_50);
    readFile(channelCount,true,false,true,&local_50);
    remove(local_50._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::ostream::flush();
    generateRandomFile(channelCount,compression,false,true,&local_50);
    readFile(channelCount,false,true,false,&local_50);
    readFile(channelCount,false,true,true,&local_50);
    remove(local_50._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::ostream::flush();
    compression = RLE_COMPRESSION;
    bVar2 = false;
  } while (bVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
readWriteTestWithAbsoluateCoordinates (
    int channelCount, int testTimes, const std::string& tempDir)
{
    cout << "Testing files with " << channelCount
         << " channels, using absolute coordinates " << testTimes << " times."
         << endl
         << flush;

    std::string fn = tempDir + "imf_test_deep_tiled_basic.exr";

    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (channelCount, compression, false, false, fn);
        readFile (channelCount, false, false, false, fn);
        readFile (channelCount, false, false, true, fn);
        remove (fn.c_str ());
        cout << endl << flush;

        generateRandomFile (channelCount, compression, true, false, fn);
        readFile (channelCount, true, false, false, fn);
        readFile (channelCount, true, false, true, fn);

        remove (fn.c_str ());
        cout << endl << flush;

        generateRandomFile (channelCount, compression, false, true, fn);
        readFile (channelCount, false, true, false, fn);
        readFile (channelCount, false, true, true, fn);

        remove (fn.c_str ());
        cout << endl << flush;
    }
}